

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

Role __thiscall QAccessibleDisplay::role(QAccessibleDisplay *this)

{
  char cVar1;
  Role RVar2;
  QObject *pQVar3;
  QLabel *this_00;
  QMovie *pQVar4;
  QProgressBar *pQVar5;
  QStatusBar *pQVar6;
  long in_FS_OFFSET;
  QPixmap aQStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = QtPrivate::qobject_cast_helper<QLabel*,QObject>(pQVar3);
  if (this_00 == (QLabel *)0x0) {
    pQVar3 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar5 = QtPrivate::qobject_cast_helper<QProgressBar*,QObject>(pQVar3);
    if (pQVar5 != (QProgressBar *)0x0) {
      RVar2 = ProgressBar;
      goto LAB_004d742e;
    }
    pQVar3 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar6 = QtPrivate::qobject_cast_helper<QStatusBar*,QObject>(pQVar3);
    if (pQVar6 != (QStatusBar *)0x0) {
      RVar2 = StatusBar;
      goto LAB_004d742e;
    }
  }
  else {
    QLabel::pixmap((QLabel *)aQStack_48);
    cVar1 = QPixmap::isNull();
    QPixmap::~QPixmap(aQStack_48);
    RVar2 = Graphic;
    if (cVar1 == '\0') goto LAB_004d742e;
    QLabel::picture((QLabel *)aQStack_48);
    cVar1 = QPicture::isNull();
    QPicture::~QPicture((QPicture *)aQStack_48);
    if (cVar1 == '\0') goto LAB_004d742e;
    pQVar4 = QLabel::movie(this_00);
    if (pQVar4 != (QMovie *)0x0) {
      RVar2 = Animation;
      goto LAB_004d742e;
    }
  }
  RVar2 = QAccessibleWidget::role(&this->super_QAccessibleWidget);
LAB_004d742e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return RVar2;
}

Assistant:

QAccessible::Role QAccessibleDisplay::role() const
{
#if QT_CONFIG(label)
    QLabel *l = qobject_cast<QLabel*>(object());
    if (l) {
        if (!l->pixmap().isNull())
            return QAccessible::Graphic;
#ifndef QT_NO_PICTURE
        if (!l->picture().isNull())
            return QAccessible::Graphic;
#endif
#if QT_CONFIG(movie)
        if (l->movie())
            return QAccessible::Animation;
#endif
#if QT_CONFIG(progressbar)
    } else if (qobject_cast<QProgressBar*>(object())) {
        return QAccessible::ProgressBar;
#endif
#if QT_CONFIG(statusbar)
    } else if (qobject_cast<QStatusBar*>(object())) {
        return QAccessible::StatusBar;
#endif
    }
#endif
    return QAccessibleWidget::role();
}